

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# avs2d_dpb.c
# Opt level: O0

MPP_RET avs2d_dpb_flush(Avs2dCtx_t *p_dec)

{
  Avs2dFrame_t *p_00;
  Avs2dFrameMgr_t *mgr;
  Avs2dFrame_t *p;
  RK_U32 i;
  MPP_RET ret;
  Avs2dCtx_t *p_dec_local;
  
  p._4_4_ = MPP_OK;
  if ((avs2d_parse_debug & 8) != 0) {
    _mpp_log_l(4,"avs2d_dpb","In.","avs2d_dpb_flush");
  }
  for (p._0_4_ = 0; (uint)p < (p_dec->frm_mgr).dpb_size; p._0_4_ = (uint)p + 1) {
    p_00 = (p_dec->frm_mgr).dpb[(uint)p];
    if (p_00->slot_idx != -1) {
      unmark_refered(p_00);
    }
  }
  dpb_remove_unused_frame(p_dec);
  do {
    if ((p_dec->frm_mgr).used_size == 0) break;
    p._4_4_ = dpb_output_next_frame(p_dec,0);
  } while (p._4_4_ == MPP_OK);
  dpb_init_management(&p_dec->frm_mgr);
  if ((avs2d_parse_debug & 8) != 0) {
    _mpp_log_l(4,"avs2d_dpb","Out.","avs2d_dpb_flush");
  }
  return p._4_4_;
}

Assistant:

MPP_RET avs2d_dpb_flush(Avs2dCtx_t *p_dec)
{
    MPP_RET ret = MPP_OK;
    RK_U32 i;
    Avs2dFrame_t *p;
    Avs2dFrameMgr_t *mgr = &p_dec->frm_mgr;

    AVS2D_PARSE_TRACE("In.");
    //!< unmark all frames refered flag
    for (i = 0; i < mgr->dpb_size; i++) {
        p = mgr->dpb[i];
        if (p->slot_idx != NO_VAL) {
            unmark_refered(p);
        }
    }

    //!< remove all unused frame
    dpb_remove_unused_frame(p_dec);

    //!< output frames in POI order
    while (mgr->used_size) {
        if ((ret = dpb_output_next_frame(p_dec, 0)) != MPP_OK) {
            break;
        }
    }

    //!< reset dpb management
    dpb_init_management(mgr);

    AVS2D_PARSE_TRACE("Out.");
    return ret;
}